

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufferDump(FILE *file,xmlBufferPtr buf)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  iVar1 = 0;
  if ((buf != (xmlBufferPtr)0x0) && (buf->content != (xmlChar *)0x0)) {
    if (file == (FILE *)0x0) {
      file = (FILE *)_stdout;
    }
    sVar2 = fwrite(buf->content,1,(ulong)buf->use,(FILE *)file);
    sVar3 = 0x7fffffff;
    if (sVar2 < 0x7fffffff) {
      sVar3 = sVar2;
    }
    iVar1 = (int)sVar3;
  }
  return iVar1;
}

Assistant:

int
xmlBufferDump(FILE *file, xmlBufferPtr buf) {
    size_t ret;

    if (buf == NULL)
	return(0);
    if (buf->content == NULL)
	return(0);
    if (file == NULL)
	file = stdout;
    ret = fwrite(buf->content, 1, buf->use, file);
    return(ret > INT_MAX ? INT_MAX : ret);
}